

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

archive * archive_read_new(void)

{
  archive *a;
  archive_entry *paVar1;
  
  a = (archive *)calloc(1,0x858);
  if (a != (archive *)0x0) {
    a->magic = 0xdeb0c5;
    a->state = 1;
    paVar1 = archive_entry_new2(a);
    *(archive_entry **)(a + 1) = paVar1;
    a->vtable = &archive_read_vtable;
    a[0xe].sconv = (archive_string_conv *)&a[0xe].current_codepage;
  }
  return a;
}

Assistant:

struct archive *
archive_read_new(void)
{
	struct archive_read *a;

	a = (struct archive_read *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_READ_MAGIC;

	a->archive.state = ARCHIVE_STATE_NEW;
	a->entry = archive_entry_new2(&a->archive);
	a->archive.vtable = &archive_read_vtable;

	a->passphrases.last = &a->passphrases.first;

	return (&a->archive);
}